

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

string * __thiscall
bsim::quad_value_bit_vector::hex_string_abi_cxx11_
          (string *__return_storage_ptr__,quad_value_bit_vector *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  uint __val;
  _Alloc_hider _Var5;
  string *psVar6;
  uint uVar7;
  long *plVar8;
  pointer pqVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint uVar11;
  size_type *psVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  uint __len;
  bool bVar17;
  string hex_digits;
  string hex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  uVar4 = this->N;
  __val = -uVar4;
  if (0 < (int)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar15 = (ulong)__val;
    uVar7 = 4;
    do {
      __len = uVar7;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00140120;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00140120;
      }
      if (uVar11 < 10000) goto LAB_00140120;
      uVar15 = uVar15 / 10000;
      uVar7 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_00140120:
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_78._M_dataplus._M_p + (uVar4 >> 0x1f),__len,__val);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_58.field_2._M_allocated_capacity = *psVar12;
    local_58.field_2._8_8_ = plVar8[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar12;
    local_58._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_58._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>();
  pqVar9 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->bits).
                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pqVar9;
  if (0 < (int)lVar13) {
    lVar16 = 0;
    do {
      uVar15 = 0;
      do {
        bVar17 = true;
        if (((long)(lVar16 + uVar15) < (long)(int)lVar13) &&
           (bVar2 = pqVar9[uVar15 + lVar16].value, 1 < bVar2)) {
          if ((bVar2 != 2) && (bVar2 != 3)) {
            __assert_fail("bits[index].is_high_impedance()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                          ,0x1b9,"std::string bsim::quad_value_bit_vector::hex_string() const");
          }
          bVar17 = false;
        }
      } while ((bVar17) && (bVar17 = uVar15 < 3, uVar15 = uVar15 + 1, bVar17));
      std::__cxx11::string::push_back((char)&local_78);
      lVar16 = lVar16 + 4;
      pqVar9 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)(this->bits).
                     super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pqVar9;
    } while ((int)lVar16 < (int)lVar13);
  }
  psVar6 = local_38;
  pcVar14 = local_78._M_dataplus._M_p + (local_78._M_string_length - 1);
  _Var5._M_p = local_78._M_dataplus._M_p;
  if (local_78._M_dataplus._M_p < pcVar14 && local_78._M_string_length != 0) {
    do {
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(_Var5._M_p + 1);
      cVar3 = *_Var5._M_p;
      *_Var5._M_p = *pcVar14;
      *pcVar14 = cVar3;
      pcVar14 = pcVar14 + -1;
      _Var5._M_p = (pointer)paVar10;
    } while (paVar10 < pcVar14);
  }
  std::operator+(local_38,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return psVar6;
}

Assistant:

std::string hex_string() const {
      std::string hex = std::to_string(N) + "'h";

      std::string hex_digits = "";

      for (int i = 0; i < ((int) bits.size()); i += 4) {
        unsigned char bit_l = 0;
        bool found_abnormal = false;

        for (int j = 0; j < 4; j++) {
          int index = i + j;
          if (index >= ((int) bits.size())) {
          } else {
            if (bits[index].is_binary()) {
              bit_l |= (bits[index].binary_value() & 0x01) << j;
            } else if (bits[index].is_unknown()) {
              bit_l = 'x';
              found_abnormal = true;
              break;
            } else {
              assert(bits[index].is_high_impedance());
              bit_l = 'z';
              found_abnormal = true;
              break;
            }
          }
        }

        if (!found_abnormal) {
          hex_digits += bit_l > 9 ? bit_l + 87 : bit_l + 48;
        } else {
          hex_digits += bit_l;
        }

      }

      std::reverse(std::begin(hex_digits), std::end(hex_digits));
      return hex + hex_digits;
    }